

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O0

EStatusCode __thiscall
JPEGImageParser::SkipTillChar
          (JPEGImageParser *this,Byte inSkipUntilValue,unsigned_long *refSkipLimit)

{
  bool bVar1;
  bool bVar2;
  EStatusCode local_24;
  bool charNotFound;
  EStatusCode status;
  unsigned_long *refSkipLimit_local;
  Byte inSkipUntilValue_local;
  JPEGImageParser *this_local;
  
  local_24 = eSuccess;
  bVar1 = true;
  while( true ) {
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, local_24 == eSuccess)) {
      bVar2 = *refSkipLimit != 0;
    }
    if (!bVar2) break;
    local_24 = ReadStreamToBuffer(this,1);
    if ((local_24 == eSuccess) &&
       (*refSkipLimit = *refSkipLimit - 1, this->mReadBuffer[0] == inSkipUntilValue)) {
      bVar1 = false;
    }
  }
  return local_24;
}

Assistant:

EStatusCode JPEGImageParser::SkipTillChar(IOBasicTypes::Byte inSkipUntilValue,unsigned long& refSkipLimit)
{
	EStatusCode status = PDFHummus::eSuccess;
	bool charNotFound = true;
	
	while(charNotFound && (PDFHummus::eSuccess == status) && (refSkipLimit > 0))
	{
		status = ReadStreamToBuffer(1);
		if(PDFHummus::eSuccess == status)
		{
			--refSkipLimit;
			if(mReadBuffer[0] == inSkipUntilValue)
				charNotFound = false;
		}
	}
	return status;
}